

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

int StateFireworks(pyhanabi_state_t *state,int color)

{
  void *pvVar1;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x167,"int StateFireworks(pyhanabi_state_t *, int)");
  }
  pvVar1 = state->state;
  if (pvVar1 != (void *)0x0) {
    if ((ulong)(long)color <
        (ulong)(*(long *)((long)pvVar1 + 0x88) - *(long *)((long)pvVar1 + 0x80) >> 2)) {
      return *(int *)(*(long *)((long)pvVar1 + 0x80) + (long)color * 4);
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x168,"int StateFireworks(pyhanabi_state_t *, int)");
}

Assistant:

int StateFireworks(pyhanabi_state_t* state, int color) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->Fireworks()
      .at(color);
}